

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib569.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  ulong uVar3;
  void *__ptr;
  char *rtsp_session_id;
  undefined8 local_40;
  ulong local_38;
  
  __stream = fopen64(libtest_arg2,"wb");
  if (__stream == (FILE *)0x0) {
    curl_mfprintf(_stderr,"couldn\'t open the Session ID File\n");
  }
  else {
    iVar1 = curl_global_init(3);
    if (iVar1 == 0) {
      lVar2 = curl_easy_init();
      if (lVar2 != 0) {
        __ptr = (void *)0x0;
        iVar1 = curl_easy_setopt(lVar2,0x272d,_stdout);
        if (iVar1 == 0) {
          __ptr = (void *)0x0;
          iVar1 = curl_easy_setopt(lVar2,0x2711,_stdout);
          if (iVar1 == 0) {
            __ptr = (void *)0x0;
            iVar1 = curl_easy_setopt(lVar2,0x29,1);
            if (iVar1 == 0) {
              __ptr = (void *)0x0;
              iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
              if (iVar1 == 0) {
                __ptr = (void *)0x0;
                iVar1 = curl_easy_setopt(lVar2,0xbd,4);
                if (iVar1 == 0) {
                  iVar1 = curl_easy_perform(lVar2);
                  if (iVar1 == 0x2b) {
                    uVar3 = 1;
                    do {
                      __ptr = (void *)curl_maprintf("%s%.4d",URL,uVar3);
                      iVar1 = 0x7e;
                      if (__ptr == (void *)0x0) {
LAB_0010153e:
                        __ptr = (void *)0x0;
                        break;
                      }
                      iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
                      if (iVar1 != 0) break;
                      free(__ptr);
                      iVar1 = curl_easy_setopt(lVar2,0xbd,4);
                      if (((iVar1 != 0) ||
                          (iVar1 = curl_easy_setopt(lVar2,0x27d0,"Fake/NotReal/JustATest;foo=baz"),
                          iVar1 != 0)) || (iVar1 = curl_easy_perform(lVar2), iVar1 != 0))
                      goto LAB_0010153e;
                      curl_easy_getinfo(lVar2,0x100024,&local_40);
                      curl_mfprintf(__stream,"Got Session ID: [%s]\n",local_40);
                      local_40 = 0;
                      local_38 = uVar3;
                      __ptr = (void *)curl_maprintf("%s%.4d",URL,(int)uVar3 + 1);
                      iVar1 = 0x7e;
                      if (__ptr == (void *)0x0) goto LAB_0010153e;
                      iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
                      if (iVar1 != 0) break;
                      free(__ptr);
                      iVar1 = curl_easy_setopt(lVar2,0xbd,7);
                      if (iVar1 != 0) goto LAB_0010153e;
                      curl_easy_perform(lVar2);
                      iVar1 = curl_easy_setopt(lVar2,0x27ce,0);
                      if (iVar1 != 0) goto LAB_0010153e;
                      uVar3 = (ulong)((int)uVar3 + 2);
                      iVar1 = 0;
                      __ptr = (void *)0x0;
                    } while ((int)local_38 != 5);
                  }
                  else {
                    __ptr = (void *)0x0;
                    curl_mfprintf(_stderr,
                                  "This should have failed. Cannot setup without a Transport: header"
                                 );
                    iVar1 = 0x7e;
                  }
                }
              }
            }
          }
        }
        fclose(__stream);
        free(__ptr);
        curl_easy_cleanup(lVar2);
        curl_global_cleanup();
        return iVar1;
      }
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
    }
    else {
      curl_mfprintf(_stderr,"curl_global_init() failed\n");
    }
    fclose(__stream);
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  int res;
  CURL *curl;
  char *stream_uri = NULL;
  char *rtsp_session_id;
  int request=1;
  int i;
  FILE *idfile = NULL;

  idfile = fopen(libtest_arg2, "wb");
  if(idfile == NULL) {
    fprintf(stderr, "couldn't open the Session ID File\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    fclose(idfile);
    return TEST_ERR_MAJOR_BAD;
  }

  if((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    fclose(idfile);
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_HEADERDATA, stdout);
  test_setopt(curl, CURLOPT_WRITEDATA, stdout);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  test_setopt(curl, CURLOPT_URL, URL);

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_SETUP);
  res = curl_easy_perform(curl);
  if(res != (int)CURLE_BAD_FUNCTION_ARGUMENT) {
    fprintf(stderr, "This should have failed. "
            "Cannot setup without a Transport: header");
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* Go through the various Session IDs */
  for(i = 0; i < 3; i++) {
    if((stream_uri = suburl(URL, request++)) == NULL) {
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }
    test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
    free(stream_uri);
    stream_uri = NULL;

    test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_SETUP);
    test_setopt(curl, CURLOPT_RTSP_TRANSPORT,
                "Fake/NotReal/JustATest;foo=baz");
    res = curl_easy_perform(curl);
    if(res)
      goto test_cleanup;

    curl_easy_getinfo(curl, CURLINFO_RTSP_SESSION_ID, &rtsp_session_id);
    fprintf(idfile, "Got Session ID: [%s]\n", rtsp_session_id);
    rtsp_session_id = NULL;

    if((stream_uri = suburl(URL, request++)) == NULL) {
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }
    test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
    free(stream_uri);
    stream_uri = NULL;

    test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_TEARDOWN);
    res = curl_easy_perform(curl);

    /* Clear for the next go-round */
    test_setopt(curl, CURLOPT_RTSP_SESSION_ID, NULL);
  }

test_cleanup:

  if(idfile)
    fclose(idfile);

  free(stream_uri);
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}